

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O1

void __thiscall
cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexHullShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  float fVar1;
  cbtVector3 *pcVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  cbtScalar *pcVar8;
  int iVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  
  if (0 < numVectors) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)supportVerticesOut->m_floats + lVar6 + 0xc) = 0xdd5e0b6b;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(uint)numVectors << 4 != lVar6);
  }
  if (0 < numVectors) {
    uVar4 = 0;
    do {
      uVar7 = (ulong)(this->m_unscaledPoints).m_size;
      if ((long)uVar7 < 1) {
        supportVerticesOut[uVar4].m_floats[3] = -1e+18;
      }
      else {
        fVar1 = *(float *)&(this->super_cbtPolyhedralConvexAabbCachingShape).
                           super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                           super_cbtConvexShape.super_cbtCollisionShape.field_0x1c;
        pcVar8 = ((this->m_unscaledPoints).m_data)->m_floats + 2;
        uVar10 = 0xffffffff;
        uVar5 = 0;
        auVar11 = SUB6416(ZEXT464(0xff7fffff),0);
        do {
          auVar3 = vfmadd231ss_fma(ZEXT416((uint)(vectors[uVar4].m_floats[1] *
                                                  *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x20 *
                                                 pcVar8[-1])),
                                   ZEXT416((uint)(fVar1 * vectors[uVar4].m_floats[0])),
                                   ZEXT416((uint)((cbtVector3 *)(pcVar8 + -2))->m_floats[0]));
          auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)(vectors[uVar4].m_floats[2] *
                                                        *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),
                                   ZEXT416((uint)*pcVar8));
          if (auVar11._0_4_ < auVar3._0_4_) {
            uVar10 = uVar5 & 0xffffffff;
          }
          auVar11 = vmaxss_avx(auVar3,auVar11);
          uVar5 = uVar5 + 1;
          pcVar8 = pcVar8 + 4;
        } while (uVar7 != uVar5);
        pcVar2 = (this->m_unscaledPoints).m_data;
        iVar9 = (int)uVar10;
        auVar3 = vinsertps_avx(ZEXT416((uint)(fVar1 * pcVar2[iVar9].m_floats[0])),
                               ZEXT416((uint)(pcVar2[iVar9].m_floats[1] *
                                             *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x20)),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(pcVar2[iVar9].m_floats[2] *
                                                    *(float *)&(this->
                                                  super_cbtPolyhedralConvexAabbCachingShape).
                                                  super_cbtPolyhedralConvexShape.
                                                  super_cbtConvexInternalShape.field_0x24)),0x28);
        *(undefined1 (*) [16])supportVerticesOut[uVar4].m_floats = auVar3;
        supportVerticesOut[uVar4].m_floats[3] = auVar11._0_4_;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)numVectors);
  }
  return;
}

Assistant:

void cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	cbtScalar newDot;
	//use 'w' component of supportVerticesOut?
	{
		for (int i = 0; i < numVectors; i++)
		{
			supportVerticesOut[i][3] = cbtScalar(-BT_LARGE_FLOAT);
		}
	}

	for (int j = 0; j < numVectors; j++)
	{
		cbtVector3 vec = vectors[j] * m_localScaling;  // dot(a*b,c) = dot(a,b*c)
		if (0 < m_unscaledPoints.size())
		{
			int i = (int)vec.maxDot(&m_unscaledPoints[0], m_unscaledPoints.size(), newDot);
			supportVerticesOut[j] = getScaledPoint(i);
			supportVerticesOut[j][3] = newDot;
		}
		else
			supportVerticesOut[j][3] = -BT_LARGE_FLOAT;
	}
}